

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O3

void __thiscall QDialogButtonBox::clear(QDialogButtonBox *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  QObject *pQVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  *(undefined8 *)(lVar1 + 0x338) = 0;
  *(undefined8 *)(lVar1 + 0x390) = 0;
  lVar5 = 0;
  do {
    lVar2 = *(long *)(lVar1 + 0x268 + lVar5 * 0x18);
    if (lVar2 != 0) {
      lVar3 = *(long *)(lVar1 + 0x260 + lVar5 * 0x18);
      lVar6 = 0;
      do {
        pQVar4 = *(QObject **)(lVar3 + lVar6);
        local_48 = QObject::destroyed;
        local_40 = 0;
        local_58 = QDialogButtonBoxPrivate::handleButtonDestroyed;
        local_50 = 0;
        QObject::disconnectImpl
                  (pQVar4,&local_48,*(QObject **)(lVar1 + 8),&local_58,
                   (QMetaObject *)&QObject::staticMetaObject);
        if (pQVar4 != (QObject *)0x0) {
          (**(code **)(*(long *)pQVar4 + 0x20))(pQVar4);
        }
        lVar6 = lVar6 + 8;
      } while (lVar2 << 3 != lVar6);
    }
    QList<QAbstractButton_*>::clear((QList<QAbstractButton_*> *)(lVar1 + 600 + lVar5 * 0x18));
    lVar5 = lVar5 + 1;
  } while (lVar5 != 9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBox::clear()
{
    Q_D(QDialogButtonBox);
    // Remove the created standard buttons, they should be in the other lists, which will
    // do the deletion
    d->standardButtonMap.clear();
    for (int i = 0; i < NRoles; ++i) {
        QList<QAbstractButton *> &list = d->buttonLists[i];
        for (auto button : std::as_const(list)) {
            QObjectPrivate::disconnect(button, &QAbstractButton::destroyed,
                                       d, &QDialogButtonBoxPrivate::handleButtonDestroyed);
            delete button;
        }
        list.clear();
    }
}